

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.h
# Opt level: O3

bool __thiscall pbrt::BSDF::HasReflection(BSDF *this)

{
  float fVar1;
  ushort uVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar6;
  DiffuseBxDF *this_00;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this_01;
  BxDFFlags BVar5;
  
  uVar6 = (this->bxdf).
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
          .bits;
  uVar2 = (ushort)(uVar6 >> 0x30);
  if ((uint)(uVar6 >> 0x31) < 3) {
    uVar4 = (uint)uVar2;
    if (uVar4 < 3) {
      this_00 = (DiffuseBxDF *)(uVar6 & 0xffffffffffff);
      if (uVar4 == 2) {
        BVar5 = DiffuseBxDF::Flags(this_00);
        bVar3 = (byte)BVar5;
      }
      else {
        fVar1 = (this_00->R).values.values[0];
        bVar3 = 5;
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          uVar6 = 0xffffffffffffffff;
          do {
            if (uVar6 == 2) {
              bVar3 = 0;
              goto LAB_004047dc;
            }
            fVar1 = (this_00->R).values.values[uVar6 + 2];
            uVar6 = uVar6 + 1;
          } while ((fVar1 == 0.0) && (!NAN(fVar1)));
          bVar3 = (uVar6 < 3) * '\x05';
        }
      }
    }
    else {
      this_01 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                (uVar6 & 0xffffffffffff);
      if (uVar4 - 2 < 2) {
        BVar5 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
                          ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                           this_01);
        bVar3 = (byte)BVar5;
      }
      else if (uVar4 - 2 == 2) {
        BVar5 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags(this_01);
        bVar3 = (byte)BVar5;
      }
      else {
        vminss_avx(ZEXT416((uint)(this_01->top).mfDistrib.alpha_y),
                   ZEXT416((uint)(this_01->top).mfDistrib.alpha_x));
        bVar3 = 0xb;
      }
    }
  }
  else if (uVar2 - 5 < 3) {
    bVar3 = 0x13;
    if (uVar2 - 5 == 2) {
      bVar3 = 9;
    }
  }
  else {
    bVar3 = 9;
    if ((1 < uVar2 - 7) && (bVar3 = 5, uVar2 - 7 == 2)) {
      vminss_avx(ZEXT416(((uint *)(uVar6 & 0xffffffffffff))[1]),
                 ZEXT416(*(uint *)(uVar6 & 0xffffffffffff)));
      bVar3 = 9;
    }
  }
LAB_004047dc:
  return (bool)(bVar3 & 1);
}

Assistant:

PBRT_CPU_GPU
    bool HasReflection() const { return (bxdf.Flags() & BxDFFlags::Reflection); }